

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Lofinator.cpp
# Opt level: O2

int Lofinator::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  int iVar1;
  EffectData *pEVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  pEVar2 = UnityAudioEffectState::GetEffectData<Lofinator::EffectData>(state);
  fVar7 = exp2f((pEVar2->field_0).data.p[1]);
  fVar8 = (float)(state->field_0).field_0.samplerate / (pEVar2->field_0).data.p[0];
  iVar1 = 0;
  uVar3 = 0;
  if (0 < outchannels) {
    uVar3 = (ulong)(uint)outchannels;
  }
  for (uVar4 = 0; uVar4 != length; uVar4 = uVar4 + 1) {
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      fVar9 = *(float *)((long)&pEVar2->field_0 + uVar5 * 4 + 0x28) + 1.0;
      *(float *)((long)&pEVar2->field_0 + uVar5 * 4 + 0x28) = fVar9;
      uVar6 = iVar1 + (int)uVar5;
      if (fVar8 <= fVar9) {
        *(float *)((long)&pEVar2->field_0 + uVar5 * 4 + 0x28) = fVar9 - fVar8;
        fVar9 = inbuffer[uVar6];
        *(float *)((long)&pEVar2->field_0 + uVar5 * 4 + 8) = fVar9;
      }
      else {
        fVar9 = *(float *)((long)&pEVar2->field_0 + uVar5 * 4 + 8);
      }
      outbuffer[uVar6] = (float)(int)(fVar9 * fVar7) * (1.0 / fVar7);
    }
    iVar1 = iVar1 + outchannels;
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;

        float quant1 = powf(2.0f, data->p[P_QUANT]);
        float quant2 = 1.0f / quant1;
        float decrate = (float)state->samplerate / data->p[P_DECRATE];
        for (unsigned int n = 0; n < length; n++)
        {
            for (int i = 0; i < outchannels; i++)
            {
                data->sampleholdcount[i] += 1.0f;
                if (data->sampleholdcount[i] >= decrate)
                {
                    data->sampleholdcount[i] -= decrate;
                    data->samplehold[i] = inbuffer[n * outchannels + i];
                }
                outbuffer[n * outchannels + i] = (signed int)(data->samplehold[i] * quant1) * quant2;
            }
        }

        return UNITY_AUDIODSP_OK;
    }